

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.c
# Opt level: O1

void * blob_read_bytes(blob_reader *blob,size_t size)

{
  uint8_t *puVar1;
  
  if (blob->overrun == false) {
    if (blob->current <= blob->end && size <= (ulong)((long)blob->end - (long)blob->current)) {
      puVar1 = blob->current;
      blob->current = puVar1 + size;
      return puVar1;
    }
    blob->overrun = true;
  }
  return (void *)0x0;
}

Assistant:

static bool
ensure_can_read(struct blob_reader *blob, size_t size)
{
   if (blob->overrun)
      return false;

   if (blob->current <= blob->end && blob->end - blob->current >= size)
      return true;

   blob->overrun = true;

   return false;
}